

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O0

float duckdb::CheckApproxQuantile(Value *quantile_val)

{
  BinderException *pBVar1;
  bool bVar2;
  Value *in_RDI;
  float quantile;
  allocator local_69;
  string local_68 [36];
  float local_44;
  undefined1 local_3d;
  allocator local_29;
  string local_28 [40];
  
  bVar2 = Value::IsNull(in_RDI);
  if (bVar2) {
    local_3d = 1;
    pBVar1 = (BinderException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"APPROXIMATE QUANTILE parameter cannot be NULL",&local_29)
    ;
    duckdb::BinderException::BinderException(pBVar1,local_28);
    local_3d = 0;
    __cxa_throw(pBVar1,&BinderException::typeinfo,BinderException::~BinderException);
  }
  local_44 = duckdb::Value::GetValue<float>();
  if ((0.0 <= local_44) && (local_44 <= 1.0)) {
    return local_44;
  }
  pBVar1 = (BinderException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,"APPROXIMATE QUANTILE can only take parameters in range [0, 1]",&local_69);
  duckdb::BinderException::BinderException(pBVar1,local_68);
  __cxa_throw(pBVar1,&BinderException::typeinfo,BinderException::~BinderException);
}

Assistant:

static float CheckApproxQuantile(const Value &quantile_val) {
	if (quantile_val.IsNull()) {
		throw BinderException("APPROXIMATE QUANTILE parameter cannot be NULL");
	}
	auto quantile = quantile_val.GetValue<float>();
	if (quantile < 0 || quantile > 1) {
		throw BinderException("APPROXIMATE QUANTILE can only take parameters in range [0, 1]");
	}

	return quantile;
}